

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transport2.c
# Opt level: O2

int ca_blob_compare(void *av,void *bv)

{
  ulong __n;
  ulong uVar1;
  int iVar2;
  host_ca *b;
  host_ca *a;
  
  __n = *(ulong *)(*(long *)((long)av + 8) + 0x10);
  uVar1 = *(ulong *)(*(long *)((long)bv + 8) + 0x10);
  if (__n < uVar1) {
    iVar2 = -1;
  }
  else {
    if (__n <= uVar1) {
      iVar2 = memcmp(*(void **)(*(long *)((long)av + 8) + 8),*(void **)(*(long *)((long)bv + 8) + 8)
                     ,__n);
      return iVar2;
    }
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

static int ca_blob_compare(void *av, void *bv)
{
    host_ca *a = (host_ca *)av, *b = (host_ca *)bv;
    strbuf *apk = a->ca_public_key, *bpk = b->ca_public_key;
    /* Ordering by public key is arbitrary here, so do whatever is easiest */
    if (apk->len < bpk->len)
        return -1;
    if (apk->len > bpk->len)
        return +1;
    return memcmp(apk->u, bpk->u, apk->len);
}